

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this,cmGeneratorTarget *target)

{
  cmOSXBundleGenerator *this_00;
  string sStack_38;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_005e8b28;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnUtility;
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  std::__cxx11::string::string
            ((string *)&sStack_38,
             (string *)
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,&sStack_38);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  std::__cxx11::string::~string((string *)&sStack_38);
  ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator)->MacContentFolders =
       &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnUtility;
  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}